

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello)

{
  ushort uVar1;
  SSL *ssl;
  char cVar2;
  bool bVar3;
  int iVar4;
  ushort *puVar5;
  _func_int_SSL_ptr_int_ptr_void_ptr *p_Var6;
  ssl_ctx_st *psVar7;
  uint i;
  ulong uVar8;
  CBS *pCVar9;
  uint desc;
  ulong unaff_R15;
  bool bVar10;
  uint16_t type;
  uint8_t alert;
  CBS extensions;
  CBS extension;
  ushort local_68;
  byte local_65;
  uint local_64;
  CBS local_60;
  SSL *local_50;
  SSL_CLIENT_HELLO *local_48;
  CBS local_40;
  
  local_50 = hs->ssl;
  (hs->extensions).sent = 0;
  local_60.data = client_hello->extensions;
  local_60.len = client_hello->extensions_len;
  desc = 0x32;
  local_48 = client_hello;
  if (local_60.len != 0) {
    desc = 0x32;
    do {
      iVar4 = CBS_get_u16(&local_60,&local_68);
      if ((iVar4 == 0) || (iVar4 = CBS_get_u16_length_prefixed(&local_60,&local_40), iVar4 == 0)) {
        desc = 0x32;
LAB_0013affc:
        bVar10 = true;
      }
      else {
        puVar5 = &kExtensions;
        uVar8 = 0;
        do {
          if (*puVar5 == local_68) {
            unaff_R15 = uVar8 & 0xffffffff;
            goto LAB_0013b017;
          }
          uVar8 = uVar8 + 1;
          puVar5 = puVar5 + 0x14;
        } while (uVar8 != 0x1c);
        puVar5 = (ushort *)0x0;
LAB_0013b017:
        if (puVar5 == (ushort *)0x0) {
          bVar10 = false;
        }
        else {
          (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)unaff_R15 & 0x1f);
          local_65 = 0x32;
          cVar2 = (**(code **)(puVar5 + 0xc))(hs,&local_65,&local_40);
          bVar10 = false;
          if (cVar2 == '\0') {
            desc = (uint)local_65;
            ERR_put_error(0x10,0,0x95,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                          ,0xfd2);
            ERR_add_error_dataf("extension %u",(ulong)local_68);
            goto LAB_0013affc;
          }
        }
      }
      if (bVar10) {
        bVar10 = false;
        goto LAB_0013b15e;
      }
    } while (local_60.len != 0);
  }
  puVar5 = &kExtensions;
  bVar10 = false;
  uVar8 = 0;
  local_64 = desc;
  do {
    if (((hs->extensions).sent >> ((uint)uVar8 & 0x1f) & 1) == 0) {
      uVar1 = *puVar5;
      if ((uVar1 == 0xff01) &&
         (bVar3 = ssl_client_cipher_list_contains_cipher(local_48,0xff), bVar3)) {
        local_40.data = "";
        local_40.len = 1;
        (hs->extensions).sent = (hs->extensions).sent | 1 << ((byte)uVar8 & 0x1f);
        pCVar9 = &local_40;
      }
      else {
        pCVar9 = (CBS *)0x0;
      }
      local_68 = CONCAT11(local_68._1_1_,0x32);
      cVar2 = (**(code **)(puVar5 + 0xc))(hs,&local_68,pCVar9);
      if (cVar2 == '\0') {
        ERR_put_error(0x10,0,0xa4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xfee);
        ERR_add_error_dataf("extension %u",(ulong)(uint)uVar1);
        desc = (uint)(byte)local_68;
        break;
      }
    }
    bVar10 = 0x1a < uVar8;
    uVar8 = uVar8 + 1;
    puVar5 = puVar5 + 0x14;
    desc = local_64;
  } while (uVar8 != 0x1c);
LAB_0013b15e:
  if (!bVar10) {
    ssl_send_alert(local_50,2,desc);
    return false;
  }
  ssl = hs->ssl;
  local_60.data = (uint8_t *)CONCAT44(local_60.data._4_4_,0x70);
  psVar7 = (ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
  p_Var6 = psVar7->servername_callback;
  if (p_Var6 == (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) {
    psVar7 = (ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    p_Var6 = psVar7->servername_callback;
    if (p_Var6 == (_func_int_SSL_ptr_int_ptr_void_ptr *)0x0) {
      iVar4 = 3;
      goto LAB_0013b1a4;
    }
  }
  iVar4 = (*p_Var6)(ssl,(int *)&local_60,psVar7->servername_arg);
LAB_0013b1a4:
  if (iVar4 == 3) {
    hs->field_0x6c9 = hs->field_0x6c9 & 0xfe;
  }
  else {
    if (iVar4 == 2) {
      ssl_send_alert(ssl,2,(int)local_60.data);
      ERR_put_error(0x10,0,0x84,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1002);
      return false;
    }
    *(uint *)&hs->field_0x6c8 =
         *(uint *)&hs->field_0x6c8 & 0xfffffeff |
         (uint)((ssl->s3->hostname)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) << 8;
  }
  return true;
}

Assistant:

bool ssl_parse_clienthello_tlsext(SSL_HANDSHAKE *hs,
                                  const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  int alert = SSL_AD_DECODE_ERROR;
  if (!ssl_scan_clienthello_tlsext(hs, client_hello, &alert)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!ssl_check_clienthello_tlsext(hs)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_TLSEXT);
    return false;
  }

  return true;
}